

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_dump(lua_State *L)

{
  int iVar1;
  luaL_Buffer b;
  luaL_Buffer lStack_2028;
  
  luaL_checktype(L,1,6);
  lua_settop(L,1);
  luaL_buffinit(L,&lStack_2028);
  iVar1 = lua_dump(L,writer,&lStack_2028);
  if (iVar1 != 0) {
    luaL_error(L,"unable to dump given function");
  }
  luaL_pushresult(&lStack_2028);
  return 1;
}

Assistant:

static int str_dump (lua_State *L) {
  luaL_Buffer b;
  luaL_checktype(L, 1, LUA_TFUNCTION);
  lua_settop(L, 1);
  luaL_buffinit(L,&b);
  if (lua_dump(L, writer, &b) != 0)
    luaL_error(L, "unable to dump given function");
  luaL_pushresult(&b);
  return 1;
}